

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O2

void __thiscall Assimp::FBX::Node::EndBinary(Node *this,StreamWriterLE *s,bool has_children)

{
  size_t sVar1;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,has_children) != 0) {
    StreamWriter<false,_false>::PutString(s,(string *)NULL_RECORD_abi_cxx11_);
  }
  sVar1 = StreamWriter<false,_false>::Tell(s);
  this->end_pos = sVar1;
  StreamWriter<false,_false>::Seek(s,this->start_pos,aiOrigin_SET);
  StreamWriter<false,_false>::Put<unsigned_int>(s,(uint)this->end_pos);
  StreamWriter<false,_false>::Seek(s,this->end_pos,aiOrigin_SET);
  return;
}

Assistant:

void FBX::Node::EndBinary(
    Assimp::StreamWriterLE &s,
    bool has_children
) {
    // if there were children, add a null record
    if (has_children) { s.PutString(Assimp::FBX::NULL_RECORD); }

    // now go back and write initial pos
    this->end_pos = s.Tell();
    s.Seek(start_pos);
    s.PutU4(uint32_t(end_pos));
    s.Seek(end_pos);
}